

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

bool __thiscall
google::protobuf::UnknownFieldSet::ParseFromZeroCopyStream
          (UnknownFieldSet *this,ZeroCopyInputStream *input)

{
  bool bVar1;
  bool local_89;
  undefined1 local_68 [8];
  CodedInputStream coded_input;
  ZeroCopyInputStream *input_local;
  UnknownFieldSet *this_local;
  
  coded_input.extension_factory_ = (MessageFactory *)input;
  io::CodedInputStream::CodedInputStream((CodedInputStream *)local_68,input);
  bVar1 = ParseFromCodedStream(this,(CodedInputStream *)local_68);
  local_89 = false;
  if (bVar1) {
    local_89 = io::CodedInputStream::ConsumedEntireMessage((CodedInputStream *)local_68);
  }
  io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_68);
  return local_89;
}

Assistant:

bool UnknownFieldSet::ParseFromZeroCopyStream(io::ZeroCopyInputStream* input) {
  io::CodedInputStream coded_input(input);
  return (ParseFromCodedStream(&coded_input) &&
          coded_input.ConsumedEntireMessage());
}